

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept_mdapi.cpp
# Opt level: O0

cl_command_queue __thiscall
CLIntercept::createMDAPICommandQueue
          (CLIntercept *this,cl_context context,cl_device_id device,
          cl_command_queue_properties properties,cl_int *errcode_ret)

{
  bool bVar1;
  CLdispatchX *pCVar2;
  cl_command_queue_properties in_RCX;
  cl_device_id in_RDX;
  cl_context in_RSI;
  CLIntercept *in_RDI;
  cl_int *in_R8;
  float __x;
  float __x_00;
  double dVar3;
  cl_uint configuration;
  cl_int errorCode;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  cl_command_queue retVal;
  lock_guard<std::mutex> lock;
  string *in_stack_00000428;
  cl_platform_id in_stack_00000430;
  CLIntercept *in_stack_00000438;
  cl_device_id in_stack_fffffffffffffe48;
  CLIntercept *in_stack_fffffffffffffe50;
  allocator *paVar4;
  MDHelper *in_stack_fffffffffffffe58;
  cl_platform_id in_stack_fffffffffffffe60;
  CLIntercept *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe90;
  cl_platform_id p_Var5;
  cl_int e;
  CEnumNameMap *in_stack_fffffffffffffe98;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  string local_f8 [36];
  cl_uint local_d4;
  cl_int local_d0;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  CLdispatchX *local_80;
  undefined1 local_71 [49];
  cl_platform_id local_40;
  cl_command_queue local_38;
  cl_int *local_28;
  cl_command_queue_properties local_20;
  cl_device_id local_18;
  cl_context local_10;
  
  e = (cl_int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe50,
             (mutex_type *)in_stack_fffffffffffffe48);
  local_38 = (cl_command_queue)0x0;
  local_40 = getPlatform(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  pCVar2 = CLIntercept::dispatchX(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (pCVar2->clCreatePerfCountersCommandQueueINTEL ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_command_queue_properties_cl_uint_cl_int_ptr
       *)0x0) {
    in_stack_fffffffffffffe98 = (CEnumNameMap *)local_71;
    p_Var5 = local_40;
    std::allocator<char>::allocator();
    e = (cl_int)((ulong)p_Var5 >> 0x20);
    std::__cxx11::string::string
              ((string *)(local_71 + 1),"clCreatePerfCountersCommandQueueINTEL",
               (allocator *)in_stack_fffffffffffffe98);
    getExtensionFunctionAddress(in_stack_00000438,in_stack_00000430,in_stack_00000428);
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
  }
  local_80 = CLIntercept::dispatchX(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  if (local_80->clCreatePerfCountersCommandQueueINTEL ==
      (_func_cl_command_queue_cl_context_cl_device_id_cl_command_queue_properties_cl_uint_cl_int_ptr
       *)0x0) {
    std::allocator<char>::allocator();
    dVar3 = (double)std::__cxx11::string::string
                              (local_a0,
                               "Couldn\'t get pointer to clCreatePerfCountersCommandQueueINTEL!\n",
                               &local_a1);
    log(in_RDI,dVar3);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else if (in_RDI->m_pMDHelper == (MDHelper *)0x0) {
    std::allocator<char>::allocator();
    dVar3 = (double)std::__cxx11::string::string
                              (local_c8,"Metrics discovery is not initialized!\n",&local_c9);
    log(in_RDI,dVar3);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  else {
    bVar1 = MetricsDiscovery::MDHelper::ActivateMetricSet(in_stack_fffffffffffffe58);
    if (bVar1) {
      local_d0 = 0;
      local_d4 = MetricsDiscovery::MDHelper::GetMetricsConfiguration
                           ((MDHelper *)in_stack_fffffffffffffe50);
      logf(in_RDI,__x);
      local_38 = (*local_80->clCreatePerfCountersCommandQueueINTEL)
                           (local_10,local_18,local_20,local_d4,&local_d0);
      if (local_38 == (cl_command_queue)0x0) {
        enumName(in_RDI);
        CEnumNameMap::name_abi_cxx11_(in_stack_fffffffffffffe98,e);
        __x_00 = (float)std::__cxx11::string::c_str();
        logf(in_RDI,__x_00);
        std::__cxx11::string::~string(local_f8);
      }
      else {
        paVar4 = &local_119;
        std::allocator<char>::allocator();
        dVar3 = (double)std::__cxx11::string::string
                                  (local_118,"clCreatePerfCountersCommandQueueINTEL succeeded.\n",
                                   paVar4);
        log(in_RDI,dVar3);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      if (local_28 != (cl_int *)0x0) {
        *local_28 = local_d0;
      }
    }
    else {
      paVar4 = &local_141;
      std::allocator<char>::allocator();
      dVar3 = (double)std::__cxx11::string::string
                                (local_140,"Metric Discovery: Couldn\'t activate metric set!\n",
                                 paVar4);
      log(in_RDI,dVar3);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x272397);
  return local_38;
}

Assistant:

cl_command_queue CLIntercept::createMDAPICommandQueue(
    cl_context context,
    cl_device_id device,
    cl_command_queue_properties properties,
    cl_int* errcode_ret )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_command_queue    retVal = NULL;

    cl_platform_id  platform = getPlatform(device);
    if( dispatchX(platform).clCreatePerfCountersCommandQueueINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clCreatePerfCountersCommandQueueINTEL" );
    }

    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clCreatePerfCountersCommandQueueINTEL == NULL )
    {
        log( "Couldn't get pointer to clCreatePerfCountersCommandQueueINTEL!\n" );
    }
    else if( m_pMDHelper == NULL )
    {
        log( "Metrics discovery is not initialized!\n" );
    }
    else if( m_pMDHelper->ActivateMetricSet() )
    {
        cl_int  errorCode = CL_SUCCESS;
        cl_uint configuration = m_pMDHelper->GetMetricsConfiguration();
        logf( "Calling clCreatePerfCountersCommandQueueINTEL with configuration %u....\n",
            configuration);

        retVal = dispatchX.clCreatePerfCountersCommandQueueINTEL(
            context,
            device,
            properties,
            configuration,
            &errorCode );
        if( retVal == NULL )
        {
            logf( "clCreatePerfCountersCommandQueueINTEL returned %s (%d)!\n",
                enumName().name( errorCode ).c_str(),
                errorCode );
        }
        else
        {
            log( "clCreatePerfCountersCommandQueueINTEL succeeded.\n" );
        }
        if( errcode_ret )
        {
            errcode_ret[0] = errorCode;
        }
    }
    else
    {
        log( "Metric Discovery: Couldn't activate metric set!\n" );
    }

    return retVal;
}